

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvreader.cc
# Opt level: O3

int __thiscall mkvparser::MkvReader::Length(MkvReader *this,longlong *total,longlong *available)

{
  if (this->m_file != (FILE *)0x0) {
    if (total != (longlong *)0x0) {
      *total = this->m_length;
    }
    if (available != (longlong *)0x0) {
      *available = this->m_length;
    }
    return 0;
  }
  return -1;
}

Assistant:

int MkvReader::Length(long long* total, long long* available) {
  if (m_file == NULL)
    return -1;

  if (total)
    *total = m_length;

  if (available)
    *available = m_length;

  return 0;
}